

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

void __thiscall
wabt::Stream::WriteMemoryDump
          (Stream *this,void *start,size_t size,size_t offset,PrintChars print_chars,char *prefix,
          char *desc)

{
  byte bVar1;
  byte c;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  byte *pbVar6;
  bool bVar7;
  
  pbVar6 = (byte *)(size + (long)start);
  pbVar3 = (byte *)start;
  while (pbVar3 < pbVar6) {
    if (prefix != (char *)0x0) {
      Writef(this,"%s",prefix);
    }
    Writef(this,"%07zx: ",pbVar3 + (offset - (long)start));
    lVar2 = 0;
    while (lVar2 < 0x10) {
      iVar5 = 2;
      while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
        if (pbVar3 + lVar2 < pbVar6) {
          Writef(this,"%02x",(ulong)pbVar3[lVar2]);
        }
        else {
          WriteU8(this,0x20,(char *)0x0,No);
          WriteU8(this,0x20,(char *)0x0,No);
        }
        lVar2 = lVar2 + 1;
      }
      WriteU8(this,0x20,(char *)0x0,No);
    }
    if (print_chars == Yes) {
      WriteU8(this,0x20,(char *)0x0,No);
      for (lVar2 = 0; (pbVar4 = pbVar3 + lVar2, (uint)lVar2 < 0x10 && (pbVar4 < pbVar6));
          lVar2 = lVar2 + 1) {
        bVar1 = *pbVar4;
        iVar5 = isprint((uint)bVar1);
        c = 0x2e;
        if (iVar5 != 0) {
          c = bVar1;
        }
        WriteChar(this,c,(char *)0x0,No);
      }
    }
    else {
      pbVar4 = pbVar3 + lVar2;
    }
    if ((desc != (char *)0x0) && (pbVar6 <= pbVar4)) {
      Writef(this,"  ; %s",desc);
    }
    WriteU8(this,10,(char *)0x0,No);
    pbVar3 = pbVar4;
  }
  return;
}

Assistant:

void Stream::WriteMemoryDump(const void* start,
                             size_t size,
                             size_t offset,
                             PrintChars print_chars,
                             const char* prefix,
                             const char* desc) {
  const uint8_t* p = static_cast<const uint8_t*>(start);
  const uint8_t* end = p + size;
  while (p < end) {
    const uint8_t* line = p;
    const uint8_t* line_end = p + DUMP_OCTETS_PER_LINE;
    if (prefix) {
      Writef("%s", prefix);
    }
    Writef("%07" PRIzx ": ", reinterpret_cast<intptr_t>(p) -
                                 reinterpret_cast<intptr_t>(start) + offset);
    while (p < line_end) {
      for (int i = 0; i < DUMP_OCTETS_PER_GROUP; ++i, ++p) {
        if (p < end) {
          Writef("%02x", *p);
        } else {
          WriteChar(' ');
          WriteChar(' ');
        }
      }
      WriteChar(' ');
    }

    if (print_chars == PrintChars::Yes) {
      WriteChar(' ');
      p = line;
      for (int i = 0; i < DUMP_OCTETS_PER_LINE && p < end; ++i, ++p)
        WriteChar(isprint(*p) ? *p : '.');
    }

    /* if there are multiple lines, only print the desc on the last one */
    if (p >= end && desc) {
      Writef("  ; %s", desc);
    }
    WriteChar('\n');
  }
}